

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpDisassemble::OnOpcodeUint32Uint32
          (BinaryReaderObjdumpDisassemble *this,uint32_t value,uint32_t value2)

{
  string_view sVar1;
  
  if (this->in_function_body == true) {
    if ((this->super_BinaryReaderObjdumpBase).current_opcode.enum_ == MemoryInit) {
      sVar1 = BinaryReaderObjdumpBase::GetSegmentName(&this->super_BinaryReaderObjdumpBase,value);
      if (sVar1._M_len != 0) {
        LogOpcode(this,"%u %u <%.*s>",value,(ulong)value2,(ulong)(uint)sVar1._M_len,sVar1._M_str);
        return (Result)Ok;
      }
    }
    LogOpcode(this,"%u %u",value,(ulong)value2);
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnOpcodeUint32Uint32(uint32_t value,
                                                            uint32_t value2) {
  if (!in_function_body)
    return Result::Ok;
  std::string_view name;
  if (current_opcode == Opcode::MemoryInit &&
      !(name = GetSegmentName(value)).empty()) {
    LogOpcode("%u %u <" PRIstringview ">", value, value2,
              WABT_PRINTF_STRING_VIEW_ARG(name));
  } else {
    LogOpcode("%u %u", value, value2);
  }
  return Result::Ok;
}